

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<bool> __thiscall
kj::HttpServer::Connection::sendError
          (Connection *this,uint statusCode,StringPtr statusText,String *body)

{
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  StringPtr statusText_00;
  String *pSVar1;
  PromiseNode *extraout_RDX;
  undefined4 in_register_00000034;
  long lVar2;
  String *in_R9;
  Promise<bool> PVar3;
  HttpHeaderId id;
  HttpHeaderId id_00;
  HttpHeaderId id_01;
  PropagateException local_181;
  undefined1 local_180 [40];
  ArrayPtr<const_kj::StringPtr> local_158;
  char *local_148;
  String *pSStack_140;
  String local_130;
  ArrayPtr<const_char> local_118;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  size_t local_f8;
  String local_f0;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  ArrayPtr<const_char> local_b8;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [8];
  HttpHeaders failed;
  String *body_local;
  uint statusCode_local;
  Connection *this_local;
  StringPtr statusText_local;
  
  lVar2 = CONCAT44(in_register_00000034,statusCode);
  HttpHeaders::HttpHeaders
            ((HttpHeaders *)local_98,*(HttpHeaderTable **)(*(long *)(lVar2 + 8) + 0x10));
  local_a8 = 0;
  uStack_a0 = 0;
  uStack_9c = 0;
  StringPtr::StringPtr((StringPtr *)&local_b8,"close");
  id.id = uStack_a0;
  id.table = (HttpHeaderTable *)local_a8;
  id._12_4_ = 0;
  HttpHeaders::set((HttpHeaders *)local_98,id,(StringPtr)local_b8);
  local_d8 = 0;
  uStack_d0 = 5;
  uStack_cc = 0;
  local_f8 = String::size(in_R9);
  str<unsigned_long>(&local_f0,&local_f8);
  id_00.id = uStack_d0;
  id_00.table = (HttpHeaderTable *)local_d8;
  id_00._12_4_ = 0;
  HttpHeaders::set((HttpHeaders *)local_98,id_00,&local_f0);
  String::~String(&local_f0);
  local_108 = 0;
  uStack_100 = 0xe;
  uStack_fc = 0;
  StringPtr::StringPtr((StringPtr *)&local_118,"text/plain");
  id_01.id = uStack_100;
  id_01.table = (HttpHeaderTable *)local_108;
  id_01._12_4_ = 0;
  HttpHeaders::set((HttpHeaders *)local_98,id_01,(StringPtr)local_118);
  local_148 = (char *)statusText.content.size_;
  pSStack_140 = body;
  ArrayPtr<const_kj::StringPtr>::ArrayPtr(&local_158,(void *)0x0);
  statusText_00.content.size_ = (size_t)pSStack_140;
  statusText_00.content.ptr = local_148;
  connectionHeaders.size_ = local_158.size_;
  connectionHeaders.ptr = local_158.ptr;
  HttpHeaders::serializeResponse
            (&local_130,(HttpHeaders *)local_98,(uint)statusText.content.ptr,statusText_00,
             connectionHeaders);
  anon_unknown_31::HttpOutputStream::writeHeaders((HttpOutputStream *)(lVar2 + 0xe8),&local_130);
  String::~String(&local_130);
  pSVar1 = mv<kj::String>(in_R9);
  String::String((String *)(local_180 + 0x10),pSVar1);
  anon_unknown_31::HttpOutputStream::writeBodyData
            ((HttpOutputStream *)(lVar2 + 0xe8),(String *)(local_180 + 0x10));
  String::~String((String *)(local_180 + 0x10));
  anon_unknown_31::HttpOutputStream::finishBody((HttpOutputStream *)(lVar2 + 0xe8));
  anon_unknown_31::HttpOutputStream::flush((HttpOutputStream *)local_180);
  Promise<void>::
  then<kj::HttpServer::Connection::sendError(unsigned_int,kj::StringPtr,kj::String)::_lambda()_1_,kj::_::PropagateException>
            ((Promise<void> *)this,(Type *)local_180,&local_181);
  Promise<void>::~Promise((Promise<void> *)local_180);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_98);
  PVar3.super_PromiseBase.node.ptr = extraout_RDX;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<bool>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> sendError(uint statusCode, kj::StringPtr statusText, kj::String body) {
    HttpHeaders failed(server.requestHeaderTable);
    failed.set(HttpHeaderId::CONNECTION, "close");
    failed.set(HttpHeaderId::CONTENT_LENGTH, kj::str(body.size()));

    failed.set(HttpHeaderId::CONTENT_TYPE, "text/plain");

    httpOutput.writeHeaders(failed.serializeResponse(statusCode, statusText));
    httpOutput.writeBodyData(kj::mv(body));
    httpOutput.finishBody();
    return httpOutput.flush().then([]() { return false; });  // loop ends after flush
  }